

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.hpp
# Opt level: O2

void __thiscall
soplex::
Validation<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::validateSolveReal(Validation<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *this,SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *soplex)

{
  string *__lhs;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  long lVar2;
  long lVar3;
  double a;
  Real RVar4;
  bool bVar5;
  type_conflict5 tVar6;
  bool bVar7;
  ostream *poVar8;
  ostream *poVar9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg;
  shared_ptr<soplex::Tolerances> *psVar10;
  string reason;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sol;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxDualViolation;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxRedCostViolation;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxRowViolation;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxBoundViolation;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumDualViolation;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumRedCostViolation;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumRowViolation;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumBoundViolation;
  undefined1 local_5e0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_5d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5d0;
  uint local_5c0 [2];
  int local_5b8;
  bool local_5b4;
  fpclass_type local_5b0;
  int32_t iStack_5ac;
  undefined1 local_5a8 [16];
  size_type local_598;
  uint auStack_590 [2];
  uint local_588 [2];
  int local_580;
  bool local_57c;
  fpclass_type local_578;
  int32_t iStack_574;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  cpp_dec_float<50U,_int,_void> local_548;
  cpp_dec_float<50U,_int,_void> local_508;
  cpp_dec_float<50U,_int,_void> local_4d0;
  cpp_dec_float<50U,_int,_void> local_498;
  cpp_dec_float<50U,_int,_void> local_460;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_428;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_368;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_328;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_268;
  Tolerances *local_228;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_220;
  size_type local_218;
  uint auStack_210 [2];
  uint local_208 [2];
  int local_200;
  bool local_1fc;
  fpclass_type local_1f8;
  int32_t iStack_1f4;
  Real local_1f0 [7];
  cpp_dec_float<50U,_int,_void> local_1b8;
  cpp_dec_float<50U,_int,_void> local_180;
  cpp_dec_float<50U,_int,_void> local_148;
  cpp_dec_float<50U,_int,_void> local_110;
  cpp_dec_float<50U,_int,_void> local_d8;
  cpp_dec_float<50U,_int,_void> local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  std::__cxx11::string::string((string *)&local_568,"",(allocator *)local_5a8);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<50U,_int,_void> *)local_5a8,0.0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_460,0.0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_498,0.0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_4d0,0.0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_508,0.0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_a0,0.0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_d8,0.0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_110,0.0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_148,0.0,(type *)0x0);
  local_548.fpclass = cpp_dec_float_finite;
  local_548.prec_elem = 10;
  local_548.data._M_elems[0] = 0;
  local_548.data._M_elems[1] = 0;
  local_548.data._M_elems[2] = 0;
  local_548.data._M_elems[3] = 0;
  local_548.data._M_elems[4] = 0;
  local_548.data._M_elems[5] = 0;
  local_548.data._M_elems._24_5_ = 0;
  local_548.data._M_elems[7]._1_3_ = 0;
  local_548.data._M_elems._32_5_ = 0;
  local_548._37_8_ = 0;
  poVar9 = (soplex->spxout).m_streams[3];
  __lhs = &this->validatesolution;
  bVar5 = std::operator==(__lhs,"+infinity");
  if (bVar5) {
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_548,
               soplex->_currentSettings->_realParamValues[6]);
  }
  else {
    bVar5 = std::operator==(__lhs,"-infinity");
    if (bVar5) {
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_548,
                 -soplex->_currentSettings->_realParamValues[6]);
    }
    else {
      a = atof((__lhs->_M_dataplus)._M_p);
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_548,a);
    }
  }
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::objValueReal((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)local_1f0,soplex);
  local_1b8.fpclass = cpp_dec_float_finite;
  local_1b8.prec_elem = 10;
  local_1b8.data._M_elems[0] = 0;
  local_1b8.data._M_elems[1] = 0;
  local_1b8.data._M_elems[2] = 0;
  local_1b8.data._M_elems[3] = 0;
  local_1b8.data._M_elems[4] = 0;
  local_1b8.data._M_elems[5] = 0;
  local_1b8.data._M_elems._24_5_ = 0;
  local_1b8.data._M_elems[7]._1_3_ = 0;
  local_1b8.data._M_elems._32_5_ = 0;
  local_1b8._37_8_ = 0;
  boost::multiprecision::default_ops::
  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_1b8,&local_548,(cpp_dec_float<50U,_int,_void> *)local_1f0);
  boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            ((type *)local_5e0,(multiprecision *)&local_1b8,arg);
  local_588[0] = local_5c0[0];
  local_588[1] = local_5c0[1];
  local_598 = local_5d0._M_allocated_capacity;
  auStack_590[0] = local_5d0._8_4_;
  auStack_590[1] = local_5d0._12_4_;
  local_5a8._0_8_ = local_5e0;
  local_5a8._8_8_ = _Stack_5d8._M_pi;
  local_580 = local_5b8;
  local_57c = local_5b4;
  local_578 = local_5b0;
  iStack_574 = iStack_5ac;
  if (soplex->_status == INForUNBD) {
    local_5e0 = (undefined1  [8])soplex->_currentSettings->_realParamValues[6];
    tVar6 = boost::multiprecision::operator==
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_548,(double *)local_5e0);
    if (!tVar6) {
      local_1f0[0] = (Real)((ulong)soplex->_currentSettings->_realParamValues[6] ^
                           0x8000000000000000);
      tVar6 = boost::multiprecision::operator==
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_548,local_1f0);
      if (!tVar6) goto LAB_002a1788;
    }
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)local_5a8,0.0);
  }
LAB_002a1788:
  local_208[0] = local_588[0];
  local_208[1] = local_588[1];
  local_218 = local_598;
  auStack_210[0] = auStack_590[0];
  auStack_210[1] = auStack_590[1];
  local_228 = (Tolerances *)local_5a8._0_8_;
  p_Stack_220 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5a8._8_8_;
  local_200 = local_580;
  local_1fc = local_57c;
  local_1f8 = local_578;
  iStack_1f4 = iStack_574;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_180,0.0,(type *)0x0);
  local_68.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 8);
  local_68.m_backend.data._M_elems._0_8_ =
       *(undefined8 *)(this->validatetolerance).m_backend.data._M_elems;
  local_68.m_backend.data._M_elems._8_8_ =
       *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 2);
  local_68.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 4);
  local_68.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 6);
  local_68.m_backend.exp = (this->validatetolerance).m_backend.exp;
  local_68.m_backend.neg = (this->validatetolerance).m_backend.neg;
  local_68.m_backend.fpclass = (this->validatetolerance).m_backend.fpclass;
  local_68.m_backend.prec_elem = (this->validatetolerance).m_backend.prec_elem;
  bVar5 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_228,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_180,&local_68);
  if (!bVar5) {
    std::__cxx11::string::append((char *)&local_568);
  }
  if (soplex->_status == OPTIMAL) {
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::getBoundViolation(soplex,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_460,
                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_a0);
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::getRowViolation(soplex,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_498,
                      (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)&local_d8);
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::getRedCostViolation
              (soplex,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)&local_4d0,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_110);
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::getDualViolation(soplex,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_508,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_148);
    pnVar1 = &this->validatetolerance;
    local_268.m_backend.data._M_elems[8] = local_460.data._M_elems[8];
    local_268.m_backend.data._M_elems[9] = local_460.data._M_elems[9];
    local_268.m_backend.data._M_elems[4] = local_460.data._M_elems[4];
    local_268.m_backend.data._M_elems[5] = local_460.data._M_elems[5];
    local_268.m_backend.data._M_elems[6] = local_460.data._M_elems[6];
    local_268.m_backend.data._M_elems[7] = local_460.data._M_elems[7];
    local_268.m_backend.data._M_elems[0] = local_460.data._M_elems[0];
    local_268.m_backend.data._M_elems[1] = local_460.data._M_elems[1];
    local_268.m_backend.data._M_elems[2] = local_460.data._M_elems[2];
    local_268.m_backend.data._M_elems[3] = local_460.data._M_elems[3];
    local_268.m_backend.exp = local_460.exp;
    local_268.m_backend.neg = local_460.neg;
    local_268.m_backend.fpclass = local_460.fpclass;
    local_268.m_backend.prec_elem = local_460.prec_elem;
    local_2a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar1->m_backend).data._M_elems;
    local_2a8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 2);
    local_2a8.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 4);
    local_2a8.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 6);
    local_2a8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 8);
    local_2a8.m_backend.exp = (this->validatetolerance).m_backend.exp;
    local_2a8.m_backend.neg = (this->validatetolerance).m_backend.neg;
    local_2a8.m_backend.fpclass = (this->validatetolerance).m_backend.fpclass;
    local_2a8.m_backend.prec_elem = (this->validatetolerance).m_backend.prec_elem;
    psVar10 = &soplex->_tolerances;
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_5e0,
               &psVar10->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    RVar4 = Tolerances::epsilon((Tolerances *)local_5e0);
    bVar7 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_268,&local_2a8,RVar4);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_5d8);
    if (!bVar7) {
      std::__cxx11::string::append((char *)&local_568);
      bVar5 = false;
    }
    local_2e8.m_backend.data._M_elems[8] = local_498.data._M_elems[8];
    local_2e8.m_backend.data._M_elems[9] = local_498.data._M_elems[9];
    local_2e8.m_backend.data._M_elems[4] = local_498.data._M_elems[4];
    local_2e8.m_backend.data._M_elems[5] = local_498.data._M_elems[5];
    local_2e8.m_backend.data._M_elems[6] = local_498.data._M_elems[6];
    local_2e8.m_backend.data._M_elems[7] = local_498.data._M_elems[7];
    local_2e8.m_backend.data._M_elems[0] = local_498.data._M_elems[0];
    local_2e8.m_backend.data._M_elems[1] = local_498.data._M_elems[1];
    local_2e8.m_backend.data._M_elems[2] = local_498.data._M_elems[2];
    local_2e8.m_backend.data._M_elems[3] = local_498.data._M_elems[3];
    local_2e8.m_backend.exp = local_498.exp;
    local_2e8.m_backend.neg = local_498.neg;
    local_2e8.m_backend.fpclass = local_498.fpclass;
    local_2e8.m_backend.prec_elem = local_498.prec_elem;
    local_328.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar1->m_backend).data._M_elems;
    local_328.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 2);
    local_328.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 4);
    local_328.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 6);
    local_328.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 8);
    local_328.m_backend.exp = (this->validatetolerance).m_backend.exp;
    local_328.m_backend.neg = (this->validatetolerance).m_backend.neg;
    local_328.m_backend.fpclass = (this->validatetolerance).m_backend.fpclass;
    local_328.m_backend.prec_elem = (this->validatetolerance).m_backend.prec_elem;
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_5e0,
               &psVar10->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    RVar4 = Tolerances::epsilon((Tolerances *)local_5e0);
    bVar7 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_2e8,&local_328,RVar4);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_5d8);
    if (!bVar7) {
      std::__cxx11::string::append((char *)&local_568);
      bVar5 = false;
    }
    local_368.m_backend.data._M_elems[8] = local_4d0.data._M_elems[8];
    local_368.m_backend.data._M_elems[9] = local_4d0.data._M_elems[9];
    local_368.m_backend.data._M_elems[4] = local_4d0.data._M_elems[4];
    local_368.m_backend.data._M_elems[5] = local_4d0.data._M_elems[5];
    local_368.m_backend.data._M_elems[6] = local_4d0.data._M_elems[6];
    local_368.m_backend.data._M_elems[7] = local_4d0.data._M_elems[7];
    local_368.m_backend.data._M_elems[0] = local_4d0.data._M_elems[0];
    local_368.m_backend.data._M_elems[1] = local_4d0.data._M_elems[1];
    local_368.m_backend.data._M_elems[2] = local_4d0.data._M_elems[2];
    local_368.m_backend.data._M_elems[3] = local_4d0.data._M_elems[3];
    local_368.m_backend.exp = local_4d0.exp;
    local_368.m_backend.neg = local_4d0.neg;
    local_368.m_backend.fpclass = local_4d0.fpclass;
    local_368.m_backend.prec_elem = local_4d0.prec_elem;
    local_3a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar1->m_backend).data._M_elems;
    local_3a8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 2);
    local_3a8.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 4);
    local_3a8.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 6);
    local_3a8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 8);
    local_3a8.m_backend.exp = (this->validatetolerance).m_backend.exp;
    local_3a8.m_backend.neg = (this->validatetolerance).m_backend.neg;
    local_3a8.m_backend.fpclass = (this->validatetolerance).m_backend.fpclass;
    local_3a8.m_backend.prec_elem = (this->validatetolerance).m_backend.prec_elem;
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_5e0,
               &psVar10->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    RVar4 = Tolerances::epsilon((Tolerances *)local_5e0);
    bVar7 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_368,&local_3a8,RVar4);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_5d8);
    if (!bVar7) {
      std::__cxx11::string::append((char *)&local_568);
      bVar5 = false;
    }
    local_3e8.m_backend.data._M_elems[8] = local_508.data._M_elems[8];
    local_3e8.m_backend.data._M_elems[9] = local_508.data._M_elems[9];
    local_3e8.m_backend.data._M_elems[4] = local_508.data._M_elems[4];
    local_3e8.m_backend.data._M_elems[5] = local_508.data._M_elems[5];
    local_3e8.m_backend.data._M_elems[6] = local_508.data._M_elems[6];
    local_3e8.m_backend.data._M_elems[7] = local_508.data._M_elems[7];
    local_3e8.m_backend.data._M_elems[0] = local_508.data._M_elems[0];
    local_3e8.m_backend.data._M_elems[1] = local_508.data._M_elems[1];
    local_3e8.m_backend.data._M_elems[2] = local_508.data._M_elems[2];
    local_3e8.m_backend.data._M_elems[3] = local_508.data._M_elems[3];
    local_3e8.m_backend.exp = local_508.exp;
    local_3e8.m_backend.neg = local_508.neg;
    local_3e8.m_backend.fpclass = local_508.fpclass;
    local_3e8.m_backend.prec_elem = local_508.prec_elem;
    local_428.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar1->m_backend).data._M_elems;
    local_428.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 2);
    local_428.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 4);
    local_428.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 6);
    local_428.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 8);
    local_428.m_backend.exp = (this->validatetolerance).m_backend.exp;
    local_428.m_backend.neg = (this->validatetolerance).m_backend.neg;
    local_428.m_backend.fpclass = (this->validatetolerance).m_backend.fpclass;
    local_428.m_backend.prec_elem = (this->validatetolerance).m_backend.prec_elem;
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_5e0,
               &psVar10->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    RVar4 = Tolerances::epsilon((Tolerances *)local_5e0);
    bVar7 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_3e8,&local_428,RVar4);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_5d8);
    if (!bVar7) {
      std::__cxx11::string::append((char *)&local_568);
      bVar5 = false;
    }
  }
  std::operator<<(poVar9,"\n");
  std::operator<<(poVar9,"Validation          :");
  if (bVar5 == false) {
    local_568._M_dataplus._M_p[local_568._M_string_length - 2] = ']';
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0,
                   " Fail [",&local_568);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0,
                   "\n");
    std::operator<<(poVar9,(string *)local_5e0);
    std::__cxx11::string::~string((string *)local_5e0);
    std::__cxx11::string::~string((string *)local_1f0);
  }
  else {
    std::operator<<(poVar9," Success\n");
  }
  poVar8 = std::operator<<(poVar9,"   Objective        : ");
  lVar2 = *(long *)poVar8;
  lVar3 = *(long *)(lVar2 + -0x18);
  *(uint *)(poVar8 + lVar3 + 0x18) = *(uint *)(poVar8 + lVar3 + 0x18) & 0xfffffefb | 0x100;
  *(undefined8 *)(poVar8 + *(long *)(lVar2 + -0x18) + 8) = 8;
  poVar8 = boost::multiprecision::operator<<
                     (poVar8,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)local_5a8);
  *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
       *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::operator<<(poVar8,"\n");
  poVar8 = std::operator<<(poVar9,"   Bound            : ");
  lVar2 = *(long *)poVar8;
  lVar3 = *(long *)(lVar2 + -0x18);
  *(uint *)(poVar8 + lVar3 + 0x18) = *(uint *)(poVar8 + lVar3 + 0x18) & 0xfffffefb | 0x100;
  *(undefined8 *)(poVar8 + *(long *)(lVar2 + -0x18) + 8) = 8;
  poVar8 = boost::multiprecision::operator<<
                     (poVar8,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_460);
  *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
       *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::operator<<(poVar8,"\n");
  poVar8 = std::operator<<(poVar9,"   Row              : ");
  lVar2 = *(long *)poVar8;
  lVar3 = *(long *)(lVar2 + -0x18);
  *(uint *)(poVar8 + lVar3 + 0x18) = *(uint *)(poVar8 + lVar3 + 0x18) & 0xfffffefb | 0x100;
  *(undefined8 *)(poVar8 + *(long *)(lVar2 + -0x18) + 8) = 8;
  poVar8 = boost::multiprecision::operator<<
                     (poVar8,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_498);
  *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
       *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::operator<<(poVar8,"\n");
  poVar8 = std::operator<<(poVar9,"   Reduced Cost     : ");
  lVar2 = *(long *)poVar8;
  lVar3 = *(long *)(lVar2 + -0x18);
  *(uint *)(poVar8 + lVar3 + 0x18) = *(uint *)(poVar8 + lVar3 + 0x18) & 0xfffffefb | 0x100;
  *(undefined8 *)(poVar8 + *(long *)(lVar2 + -0x18) + 8) = 8;
  poVar8 = boost::multiprecision::operator<<
                     (poVar8,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_4d0);
  *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
       *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::operator<<(poVar8,"\n");
  poVar9 = std::operator<<(poVar9,"   Dual             : ");
  lVar2 = *(long *)poVar9;
  lVar3 = *(long *)(lVar2 + -0x18);
  *(uint *)(poVar9 + lVar3 + 0x18) = *(uint *)(poVar9 + lVar3 + 0x18) & 0xfffffefb | 0x100;
  *(undefined8 *)(poVar9 + *(long *)(lVar2 + -0x18) + 8) = 8;
  poVar9 = boost::multiprecision::operator<<
                     (poVar9,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_508);
  *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
       *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::operator<<(poVar9,"\n");
  std::__cxx11::string::~string((string *)&local_568);
  return;
}

Assistant:

void Validation<R>::validateSolveReal(SoPlexBase<R>& soplex)
{
   bool passedValidation = true;
   std::string reason = "";
   R objViolation = 0.0;
   R maxBoundViolation = 0.0;
   R maxRowViolation = 0.0;
   R maxRedCostViolation = 0.0;
   R maxDualViolation = 0.0;
   R sumBoundViolation = 0.0;
   R sumRowViolation = 0.0;
   R sumRedCostViolation = 0.0;
   R sumDualViolation = 0.0;
   R sol;

   std::ostream& os = soplex.spxout.getStream(SPxOut::INFO1);

   if(validatesolution == "+infinity")
   {
      sol = soplex.realParam(SoPlexBase<R>::INFTY);
   }
   else if(validatesolution == "-infinity")
   {
      sol = -soplex.realParam(SoPlexBase<R>::INFTY);
   }
   else
   {
      sol = atof(validatesolution.c_str());
   }

   objViolation = spxAbs(sol - soplex.objValueReal());

   // skip check in case presolving detected infeasibility/unboundedness
   if(SPxSolverBase<R>::INForUNBD == soplex.status() &&
         (sol == soplex.realParam(SoPlexBase<R>::INFTY)
          || sol == -soplex.realParam(SoPlexBase<R>::INFTY)))
      objViolation = 0.0;

   if(! EQ(objViolation, R(0.0), validatetolerance))
   {
      passedValidation = false;
      reason += "Objective Violation; ";
   }

   if(SPxSolverBase<R>::OPTIMAL == soplex.status())
   {
      soplex.getBoundViolation(maxBoundViolation, sumBoundViolation);
      soplex.getRowViolation(maxRowViolation, sumRowViolation);
      soplex.getRedCostViolation(maxRedCostViolation, sumRedCostViolation);
      soplex.getDualViolation(maxDualViolation, sumDualViolation);

      if(! LE(maxBoundViolation, validatetolerance, soplex.tolerances()->epsilon()))
      {
         passedValidation = false;
         reason += "Bound Violation; ";
      }

      if(! LE(maxRowViolation, validatetolerance, soplex.tolerances()->epsilon()))
      {
         passedValidation = false;
         reason += "Row Violation; ";
      }

      if(! LE(maxRedCostViolation, validatetolerance, soplex.tolerances()->epsilon()))
      {
         passedValidation = false;
         reason += "Reduced Cost Violation; ";
      }

      if(! LE(maxDualViolation, validatetolerance, soplex.tolerances()->epsilon()))
      {
         passedValidation = false;
         reason += "Dual Violation; ";
      }
   }

   os << "\n";
   os << "Validation          :";

   if(passedValidation)
      os << " Success\n";
   else
   {
      reason[reason.length() - 2] = ']';
      os << " Fail [" + reason + "\n";
   }

   os << "   Objective        : " << std::scientific << std::setprecision(
         8) << objViolation << std::fixed << "\n";
   os << "   Bound            : " << std::scientific << std::setprecision(
         8) << maxBoundViolation << std::fixed << "\n";
   os << "   Row              : " << std::scientific << std::setprecision(
         8) << maxRowViolation << std::fixed << "\n";
   os << "   Reduced Cost     : " << std::scientific << std::setprecision(
         8) << maxRedCostViolation << std::fixed << "\n";
   os << "   Dual             : " << std::scientific << std::setprecision(
         8) << maxDualViolation << std::fixed << "\n";
}